

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TypeSpecializeFloatUnary
          (GlobOpt *this,Instr **pInstr,Value *src1Val,Value **pDstVal,bool skipDst)

{
  Opnd *this_00;
  StackSym *sym;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  OpCode opcode;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar4;
  JITTimeFunctionBody *this_01;
  FunctionJITTimeInfo *this_02;
  char16 *pcVar5;
  RegOpnd *pRVar6;
  StackSym *sym_00;
  Value *pVVar7;
  char *pDstVal_00;
  OpCode OVar8;
  char local_34;
  
  OVar8 = (*pInstr)->m_opcode;
  pDstVal_00 = (char *)pDstVal;
  opcode = OVar8;
  if (src1Val == (Value *)0x0) {
LAB_0045d991:
    bVar2 = OpCodeAttr::IsInlineBuiltIn(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      pDstVal_00 = 
      "src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)"
      ;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2936,
                         "(src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))"
                         ,
                         "src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode)"
                        );
      if (!bVar2) goto LAB_0045dda6;
      *puVar4 = 0;
    }
  }
  else {
    bVar2 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType);
    if (!bVar2) {
      opcode = (*pInstr)->m_opcode;
      goto LAB_0045d991;
    }
  }
  if ((this->field_0xf5 & 0x20) == 0) {
LAB_0045d9fc:
    pVVar7 = (Value *)0x0;
  }
  else {
    bVar2 = OpCodeAttr::IsInlineBuiltIn((*pInstr)->m_opcode);
    local_34 = skipDst;
    if (bVar2) {
      pVVar7 = (Value *)0x0;
      goto LAB_0045db52;
    }
    pVVar7 = (Value *)0x0;
    if (OVar8 < StElemI_A) {
      if (OVar8 < Conv_Num) {
        if (OVar8 - 0xe < 2) goto LAB_0045daa6;
        if (OVar8 != Neg_A) goto LAB_0045dcad;
      }
      else {
        if (OVar8 != Conv_Num) {
          if (OVar8 != Ld_A) goto LAB_0045dcad;
          goto LAB_0045daa6;
        }
        if (src1Val == (Value *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x295c,"(src1Val)","src1Val");
          if (!bVar2) goto LAB_0045dda6;
          *puVar4 = 0;
        }
        bVar2 = ValueType::IsNumber(&src1Val->valueInfo->super_ValueType);
        OVar8 = Ld_A;
        pVVar7 = src1Val;
        if (!bVar2) {
          pRVar6 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
          sym = pRVar6->m_sym;
          sym_00 = IR::Opnd::GetStackSym((*pInstr)->m_dst);
          pVVar7 = NewGenericValue(this,(ValueType)0x108,&sym_00->super_Sym);
          bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                            (&this->currentBlock->globOptData,&sym->super_Sym);
          if (!bVar2) {
            pRVar6 = IR::Opnd::AsRegOpnd((*pInstr)->m_dst);
            pRVar6->field_0x18 = pRVar6->field_0x18 | 4;
          }
        }
      }
    }
    else {
      pVVar7 = (Value *)0x0;
      if (OVar8 < ArgOut_A_InlineBuiltIn) {
        if ((OVar8 == StElemI_A) || (OVar8 == StElemI_A_Strict)) goto LAB_0045da78;
        goto LAB_0045dcad;
      }
      if (OVar8 == StElemC) {
LAB_0045da78:
        bVar2 = TypeSpecializeStElem(this,pInstr,src1Val,(Value **)pDstVal_00);
        return bVar2;
      }
      if (OVar8 != ArgOut_A_InlineBuiltIn) goto LAB_0045dcad;
      local_34 = '\x01';
LAB_0045daa6:
      OVar3 = IR::Opnd::GetKind((*pInstr)->m_src1);
      if (OVar3 == OpndKindReg) {
        this_00 = (*pInstr)->m_src1;
        OVar3 = IR::Opnd::GetKind(this_00);
        if (OVar3 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar2) {
LAB_0045dda6:
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *puVar4 = 0;
        }
        bVar2 = GlobOptBlockData::IsFloat64TypeSpecialized
                          (&this->currentBlock->globOptData,(Sym *)this_00[1]._vptr_Opnd);
        if (!bVar2) goto LAB_0045d9fc;
      }
      pVVar7 = (Value *)0x0;
      if ((*pInstr)->m_opcode == Ld_A) {
        pVVar7 = src1Val;
      }
    }
LAB_0045db52:
    ToTypeSpecUse(this,*pInstr,(*pInstr)->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0,
                  TyFloat64,BailOutPrimitiveButString,false,(Instr *)0x0);
    if (((local_34 == '\0') && ((*pInstr)->m_dst != (Opnd *)0x0)) &&
       (TypeSpecializeFloatDst(this,*pInstr,pVVar7,src1Val,(Value *)0x0,pDstVal),
       this->prePassLoop == (Loop *)0x0)) {
      (*pInstr)->m_opcode = OVar8;
    }
    this_01 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_01);
    this_02 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_02);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,GlobOptPhase,sourceContextId,functionId);
    if (bVar2) {
      Output::Print(L"TRACE ");
      if (this->prePassLoop != (Loop *)0x0) {
        Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                      (ulong)(this->prePassLoop->loopNumber - 1));
      }
      Output::Print(L": ");
      Output::Print(L"Type specialized to FLOAT: ");
      IR::Instr::Dump(*pInstr);
      Output::Flush();
    }
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015bc490,FloatTypeSpecPhase);
    pVVar7 = (Value *)&DAT_00000001;
    if (bVar2) {
      Output::Print(L"Type specialized to FLOAT: ");
      pcVar5 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
      Output::Print(L"%s \n",pcVar5);
    }
  }
LAB_0045dcad:
  return SUB81(pVVar7,0);
}

Assistant:

bool
GlobOpt::TypeSpecializeFloatUnary(IR::Instr **pInstr, Value *src1Val, Value **pDstVal, bool skipDst /* = false */)
{
    IR::Instr *&instr = *pInstr;
    IR::Opnd *src1;
    IR::Opnd *dst;
    Js::OpCode opcode = instr->m_opcode;
    Value *valueToTransfer = nullptr;

    Assert(src1Val && src1Val->GetValueInfo()->IsLikelyNumber() || OpCodeAttr::IsInlineBuiltIn(instr->m_opcode));

    if (!this->DoFloatTypeSpec())
    {
        return false;
    }

    // For inline built-ins we need to do type specialization. Check upfront to avoid duplicating same case labels.
    if (!OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        switch (opcode)
        {
        case Js::OpCode::ArgOut_A_InlineBuiltIn:
            skipDst = true;
            // fall-through

        case Js::OpCode::Ld_A:
        case Js::OpCode::BrTrue_A:
        case Js::OpCode::BrFalse_A:
            if (instr->GetSrc1()->IsRegOpnd())
            {
                StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                if (CurrentBlockData()->IsFloat64TypeSpecialized(sym) == false)
                {
                    // Type specializing an Ld_A isn't worth it, unless the src
                    // is already type specialized
                    return false;
                }
            }
            if (instr->m_opcode == Js::OpCode::Ld_A)
            {
                valueToTransfer = src1Val;
            }
            break;
        case Js::OpCode::Neg_A:
            break;

        case Js::OpCode::Conv_Num:
            Assert(src1Val);
            opcode = Js::OpCode::Ld_A;
            valueToTransfer = src1Val;
            if (!src1Val->GetValueInfo()->IsNumber())
            {
                StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
                valueToTransfer = NewGenericValue(ValueType::Float, instr->GetDst()->GetStackSym());
                if (CurrentBlockData()->IsFloat64TypeSpecialized(sym) == false)
                {
                    // Set the dst as a nonDeadStore. We want to keep the Ld_A to prevent the FromVar from
                    // being dead-stored, as it could cause implicit calls.
                    dst = instr->GetDst();
                    dst->AsRegOpnd()->m_dontDeadStore = true;
                }
            }
            break;

        case Js::OpCode::StElemI_A:
        case Js::OpCode::StElemI_A_Strict:
        case Js::OpCode::StElemC:
            return TypeSpecializeStElem(pInstr, src1Val, pDstVal);

        default:
            return false;
        }
    }

    // Make sure the srcs are specialized
    src1 = instr->GetSrc1();

    // Use original val when calling toFloat64 as this is what we'll use to try hoisting the fromVar if we're in a loop.
    this->ToFloat64(instr, src1, this->currentBlock, src1Val, nullptr, IR::BailOutPrimitiveButString);

    if (!skipDst)
    {
        dst = instr->GetDst();
        if (dst)
        {
            this->TypeSpecializeFloatDst(instr, valueToTransfer, src1Val, nullptr, pDstVal);
            if (!this->IsLoopPrePass())
            {
                instr->m_opcode = opcode;
            }
        }
    }

    GOPT_TRACE_INSTR(instr, _u("Type specialized to FLOAT: "));

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FloatTypeSpecPhase))
    {
        Output::Print(_u("Type specialized to FLOAT: "));
        Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    return true;
}